

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O2

Lpk_Res_t * Lpk_DsdAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p,int nShared)

{
  int iVar1;
  Kit_DsdNtk_t *pNtk;
  Vec_Int_t *vBSets;
  uint uVar2;
  uint uVar3;
  Lpk_Res_t *pLVar4;
  long lVar5;
  uint *(*ppTruths) [16];
  char pCofVars [5];
  Kit_DsdNtk_t *pNtks [8];
  
  pNtks[6] = (Kit_DsdNtk_t *)0x0;
  pNtks[7] = (Kit_DsdNtk_t *)0x0;
  pNtks[4] = (Kit_DsdNtk_t *)0x0;
  pNtks[5] = (Kit_DsdNtk_t *)0x0;
  pNtks[2] = (Kit_DsdNtk_t *)0x0;
  pNtks[3] = (Kit_DsdNtk_t *)0x0;
  pNtks[0] = (Kit_DsdNtk_t *)0x0;
  pNtks[1] = (Kit_DsdNtk_t *)0x0;
  if ((*(uint *)&p->field_0x8 & 0xf000) < 0x2001) {
    __assert_fail("p->nLutK >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d1,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  if (3 < (uint)nShared) {
    __assert_fail("nShared >= 0 && nShared <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d2,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  uVar2 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  if ((-1 << (sbyte)uVar2 ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d3,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  pNtk = Kit_DsdDecomposeExpand((uint *)(p + 1),uVar2);
  pNtks[0] = pNtk;
  if (pMan->pPars->fVerbose != 0) {
    iVar1 = Kit_DsdNonDsdSizeMax(pNtk);
    pMan->nBlocks[iVar1] = pMan->nBlocks[iVar1] + 1;
  }
  vBSets = Lpk_ComputeBoundSets(pNtk,*(uint *)&p->field_0x8 >> 0xc & 0xf);
  uVar2 = Lpk_DsdLateArriving(p);
  Lpk_FunCompareBoundSets(p,vBSets,0,0xffff,uVar2,&Lpk_DsdAnalize::Res0);
  Vec_IntFree(vBSets);
  uVar2 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
  if (Lpk_DsdAnalize::Res0.nBSVars == uVar2 - 1 || Lpk_DsdAnalize::Res0.nBSVars == uVar2) {
LAB_003e7f1d:
    pLVar4 = &Lpk_DsdAnalize::Res0;
    goto LAB_003e80b1;
  }
  if (nShared != 0) {
    ppTruths = pMan->ppTruths;
    Kit_TruthCopy(pMan->ppTruths[0][0],(uint *)(p + 1),*(uint *)&p->field_0x8 >> 7 & 0x1f);
    iVar1 = Lpk_DsdAnalizeOne(p,ppTruths,pNtks,pCofVars,1,&Lpk_DsdAnalize::Res1);
    if (iVar1 != 0) {
      uVar2 = *(uint *)&p->field_0x8;
      uVar3 = uVar2 >> 0xc & 0xf;
      if ((int)uVar3 <= Lpk_DsdAnalize::Res1.nBSVars) {
        __assert_fail("pRes1->nBSVars <= (int)p->nLutK - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                      ,0x1eb,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
      }
      if (Lpk_DsdAnalize::Res1.nBSVars != uVar3 - 1) {
        if (Lpk_DsdAnalize::Res0.nBSVars == uVar3 - 2) goto LAB_003e7f1d;
        if (Lpk_DsdAnalize::Res1.nBSVars != uVar3 - 2) {
          if (nShared != 1) {
            if (uVar3 < 4) {
LAB_003e8034:
              if (0x4000 < (uVar2 & 0xf000)) {
                pLVar4 = &Lpk_DsdAnalize::Res3;
                iVar1 = Lpk_DsdAnalizeOne(p,ppTruths,pNtks,pCofVars,3,&Lpk_DsdAnalize::Res3);
                if (iVar1 != 0) {
                  uVar2 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
                  iVar1 = uVar2 - 3;
                  if (iVar1 < Lpk_DsdAnalize::Res3.nBSVars) {
                    __assert_fail("pRes3->nBSVars <= (int)p->nLutK - 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                                  ,0x210,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)")
                    ;
                  }
                  if (Lpk_DsdAnalize::Res3.nBSVars != iVar1) {
                    iVar1 = uVar2 - 4;
                    pLVar4 = &Lpk_DsdAnalize::Res0;
                    if ((Lpk_DsdAnalize::Res0.nBSVars != iVar1) &&
                       (pLVar4 = &Lpk_DsdAnalize::Res1, Lpk_DsdAnalize::Res1.nBSVars != iVar1)) {
                      if (Lpk_DsdAnalize::Res2.nBSVars == iVar1) {
                        pLVar4 = &Lpk_DsdAnalize::Res2;
                      }
                      else {
                        pLVar4 = (Lpk_Res_t *)0x0;
                        if (Lpk_DsdAnalize::Res3.nBSVars == iVar1) {
                          pLVar4 = &Lpk_DsdAnalize::Res3;
                        }
                      }
                    }
                  }
                  goto LAB_003e80b1;
                }
              }
            }
            else {
              pLVar4 = &Lpk_DsdAnalize::Res2;
              iVar1 = Lpk_DsdAnalizeOne(p,ppTruths,pNtks,pCofVars,2,&Lpk_DsdAnalize::Res2);
              if (iVar1 != 0) {
                uVar2 = *(uint *)&p->field_0x8;
                uVar3 = uVar2 >> 0xc & 0xf;
                iVar1 = uVar3 - 2;
                if (Lpk_DsdAnalize::Res2.nBSVars != iVar1 && iVar1 <= Lpk_DsdAnalize::Res2.nBSVars)
                {
                  __assert_fail("pRes2->nBSVars <= (int)p->nLutK - 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                                ,0x1fa,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
                }
                if (Lpk_DsdAnalize::Res2.nBSVars == iVar1) goto LAB_003e80b1;
                iVar1 = uVar3 - 3;
                if (Lpk_DsdAnalize::Res0.nBSVars == iVar1) goto LAB_003e7f1d;
                if (Lpk_DsdAnalize::Res1.nBSVars == iVar1) goto LAB_003e7f95;
                if (Lpk_DsdAnalize::Res2.nBSVars == iVar1) goto LAB_003e80b1;
                if (nShared != 2) goto LAB_003e8034;
              }
            }
          }
          goto LAB_003e80ae;
        }
      }
LAB_003e7f95:
      pLVar4 = &Lpk_DsdAnalize::Res1;
      goto LAB_003e80b1;
    }
  }
LAB_003e80ae:
  pLVar4 = (Lpk_Res_t *)0x0;
LAB_003e80b1:
  for (lVar5 = 0; (uint)lVar5 >> ((byte)nShared & 0x1f) == 0; lVar5 = lVar5 + 1) {
    if (pNtks[lVar5] != (Kit_DsdNtk_t *)0x0) {
      Kit_DsdNtkFree(pNtks[lVar5]);
    }
  }
  return pLVar4;
}

Assistant:

Lpk_Res_t * Lpk_DsdAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p, int nShared )
{ 
    static Lpk_Res_t Res0, * pRes0 = &Res0;
    static Lpk_Res_t Res1, * pRes1 = &Res1;
    static Lpk_Res_t Res2, * pRes2 = &Res2;
    static Lpk_Res_t Res3, * pRes3 = &Res3;
    int fUseBackLooking = 1;
    Lpk_Res_t * pRes = NULL;
    Vec_Int_t * vBSets;
    Kit_DsdNtk_t * pNtks[8] = {NULL};
    char pCofVars[5];
    int i;

    assert( p->nLutK >= 3 );
    assert( nShared >= 0 && nShared <= 3 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );

    // try decomposition without cofactoring
    pNtks[0] = Kit_DsdDecomposeExpand( Lpk_FunTruth( p, 0 ), p->nVars );
    if ( pMan->pPars->fVerbose )
        pMan->nBlocks[ Kit_DsdNonDsdSizeMax(pNtks[0]) ]++;
    vBSets = Lpk_ComputeBoundSets( pNtks[0], p->nLutK );
    Lpk_FunCompareBoundSets( p, vBSets, 0, 0xFFFF, Lpk_DsdLateArriving(p), pRes0 );
    Vec_IntFree( vBSets );

    // check the result
    if ( pRes0->nBSVars == (int)p->nLutK )
        { pRes = pRes0; goto finish; }
    if ( pRes0->nBSVars == (int)p->nLutK - 1 )
        { pRes = pRes0; goto finish; }
    if ( nShared == 0 )
        goto finish;

    // prepare storage
    Kit_TruthCopy( pMan->ppTruths[0][0], Lpk_FunTruth( p, 0 ), p->nVars );

    // cofactor 1 time
    if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 1, pRes1 ) )
        goto finish;
    assert( pRes1->nBSVars <= (int)p->nLutK - 1 );
    if ( pRes1->nBSVars == (int)p->nLutK - 1 )
        { pRes = pRes1; goto finish; }
    if ( pRes0->nBSVars == (int)p->nLutK - 2 )
        { pRes = pRes0; goto finish; }
    if ( pRes1->nBSVars == (int)p->nLutK - 2 )
        { pRes = pRes1; goto finish; }
    if ( nShared == 1 )
        goto finish;

    // cofactor 2 times
    if ( p->nLutK >= 4 ) 
    {
        if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 2, pRes2 ) )
            goto finish;
        assert( pRes2->nBSVars <= (int)p->nLutK - 2 );
        if ( pRes2->nBSVars == (int)p->nLutK - 2 )
            { pRes = pRes2; goto finish; }
        if ( fUseBackLooking )
        {
            if ( pRes0->nBSVars == (int)p->nLutK - 3 )
                { pRes = pRes0; goto finish; }
            if ( pRes1->nBSVars == (int)p->nLutK - 3 )
                { pRes = pRes1; goto finish; }
        }
        if ( pRes2->nBSVars == (int)p->nLutK - 3 )
            { pRes = pRes2; goto finish; }
        if ( nShared == 2 )
            goto finish;
        assert( nShared == 3 );
    }

    // cofactor 3 times
    if ( p->nLutK >= 5 ) 
    {
        if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 3, pRes3 ) )
            goto finish;
        assert( pRes3->nBSVars <= (int)p->nLutK - 3 );
        if ( pRes3->nBSVars == (int)p->nLutK - 3 )
            { pRes = pRes3; goto finish; }
        if ( fUseBackLooking )
        {
            if ( pRes0->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes0; goto finish; }
            if ( pRes1->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes1; goto finish; }
            if ( pRes2->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes2; goto finish; }
        }
        if ( pRes3->nBSVars == (int)p->nLutK - 4 )
            { pRes = pRes3; goto finish; }
    }

finish:
    // free the networks
    for ( i = 0; i < (1<<nShared); i++ )
        if ( pNtks[i] )
            Kit_DsdNtkFree( pNtks[i] );
    // choose the best under these conditions
    return pRes;
}